

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,TermList *ptl,VarCounts *varCnts,uint hash_begin)

{
  Term *term;
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t i;
  long lVar5;
  Term *pTVar6;
  undefined4 local_54;
  SubtermIterator local_50;
  
  term = (Term *)ptl->_content;
  if (((ulong)term & 1) != 0) {
    uVar3 = computeHashAndCountVariables(this,(uint)((ulong)term >> 2),varCnts,hash_begin);
    return uVar3;
  }
  pTVar6 = term;
  if (*(int *)&term->field_0xc < 0) {
    iVar4 = 0;
    do {
      pTVar6 = *(Term **)&(pTVar6->field_9)._vars;
      if (((ulong)pTVar6 & 1) != 0) {
        uVar3 = 3;
        goto LAB_002bbcdd;
      }
      iVar4 = iVar4 + 2;
    } while (*(int *)&pTVar6->field_0xc < 0);
  }
  else {
    iVar4 = 0;
  }
  uVar3 = (pTVar6->field_9)._vars;
LAB_002bbcdd:
  if (iVar4 + uVar3 == 0) {
    local_50.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore = (_func_int **)term;
    lVar5 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_50.super_IteratorCore<Kernel::TermList>.
                                     _vptr_IteratorCore + lVar5) ^ hash_begin) * 0x1000193;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
  }
  else {
    local_50.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)
         CONCAT44(local_50.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore._4_4_,
                  term->_functor);
    lVar5 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_50.super_IteratorCore<Kernel::TermList>.
                                     _vptr_IteratorCore + lVar5) ^ hash_begin) * 0x1000193;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    Kernel::SubtermIterator::SubtermIterator(&local_50,term);
    while (bVar2 = Kernel::SubtermIterator::hasNext(&local_50), bVar2) {
      local_50._used = true;
      uVar1 = (*(TermList ***)
                ((long)local_50._stack._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>.
                       _M_head_impl + 0x10))[-1]->_content;
      if ((uVar1 & 1) == 0) {
        local_54 = *(undefined4 *)(uVar1 + 8);
        lVar5 = 0;
        do {
          hash_begin = (*(byte *)((long)&local_54 + lVar5) ^ hash_begin) * 0x1000193;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
      }
      else {
        hash_begin = computeHashAndCountVariables(this,(uint)(uVar1 >> 2),varCnts,hash_begin);
      }
    }
    local_50.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
         (_func_int **)&PTR__SubtermIterator_00b3d8d0;
    Lib::Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_50._stack);
  }
  return hash_begin;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(TermList* ptl, VarCounts& varCnts, unsigned hash_begin) {
  if (ptl->isVar()) {
    return computeHashAndCountVariables(ptl->var(),varCnts,hash_begin);
  }

  Term* t = ptl->term();

  if (t->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(t, hash_begin);
  }

  unsigned hash = termFunctorHash(t,hash_begin);

  SubtermIterator sti(t);
  while(sti.hasNext()) {
    TermList tl = sti.next();

    if (tl.isVar()) {
      hash = computeHashAndCountVariables(tl.var(),varCnts,hash);
    } else {
      hash = termFunctorHash(tl.term(),hash);
    }
  }

  return hash;
}